

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O1

void __thiscall SGParser::Generator::StdGrammarStackElement::Cleanup(StdGrammarStackElement *this)

{
  StdGrammarStackElement *pSVar1;
  void *pvVar2;
  ulong uVar3;
  StdGrammarStackElement *pSVar4;
  StdGrammarStackElement *se;
  
  pSVar4 = (StdGrammarStackElement *)(this->field_1).pStringVec;
  if (pSVar4 == (StdGrammarStackElement *)0x0) {
    return;
  }
  switch(this->Type + 0xf0000000 >> 0x1c) {
  case 0:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                  ,0x206,"void SGParser::Generator::StdGrammarStackElement::Cleanup()");
  case 1:
    if ((uint *)*(undefined1 **)
                 &pSVar4->super_ParseStackElement<SGParser::Generator::StdGrammarToken> !=
        &pSVar4->Type) {
      operator_delete(*(undefined1 **)
                       &pSVar4->super_ParseStackElement<SGParser::Generator::StdGrammarToken>,
                      *(long *)&pSVar4->Type + 1);
    }
    uVar3 = 0x20;
    break;
  case 2:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pSVar4);
    goto LAB_00132a05;
  case 3:
    Cleanup(pSVar4);
    pSVar4 = (StdGrammarStackElement *)(this->field_1).pData;
    if (pSVar4 == (StdGrammarStackElement *)0x0) goto switchD_001329a4_default;
    uVar3 = 0x38;
    break;
  case 4:
    pSVar1 = (StdGrammarStackElement *)
             (pSVar4->super_ParseStackElement<SGParser::Generator::StdGrammarToken>).TerminalMarker;
    for (pSVar4 = *(StdGrammarStackElement **)
                   &pSVar4->super_ParseStackElement<SGParser::Generator::StdGrammarToken>;
        pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      Cleanup(pSVar4);
    }
    pSVar4 = (StdGrammarStackElement *)(this->field_1).pStringVec;
    if (pSVar4 == (StdGrammarStackElement *)0x0) goto switchD_001329a4_default;
    pvVar2 = *(void **)&pSVar4->super_ParseStackElement<SGParser::Generator::StdGrammarToken>;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,*(long *)&pSVar4->Type - (long)pvVar2);
    }
LAB_00132a05:
    uVar3 = 0x18;
    break;
  default:
    goto switchD_001329a4_default;
  }
  operator_delete(pSVar4,uVar3);
switchD_001329a4_default:
  (this->field_1).pData = (void *)0x0;
  return;
}

Assistant:

void Cleanup() {
        if (!pData)
            return;

        switch (Type & DataTypeMask) {
            case DataVoid:      SG_ASSERT(false);  break; // Shouldn't be here
            case DataString:    delete pString;    break;
            case DataStringVec: delete pStringVec; break;

            case DataStackElement:
                pStackElement->Cleanup();
                delete pStackElement;
                break;

            case DataStackElementVec:
                for (auto& se : *pStackElementVec)
                    se.Cleanup();
                delete pStackElementVec;
                break;
        }

        pData = nullptr;
    }